

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::AudioTrack::AudioTrack(AudioTrack *this,uint *seed)

{
  Track::Track(&this->super_Track,seed);
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__AudioTrack_0054b1e8;
  this->bit_depth_ = 0;
  this->channels_ = 1;
  this->sample_rate_ = 0.0;
  return;
}

Assistant:

AudioTrack::AudioTrack(unsigned int* seed)
    : Track(seed), bit_depth_(0), channels_(1), sample_rate_(0.0) {}